

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O1

bool parse_json_stats(string *foz_path,Document *doc)

{
  uint uVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Document *this;
  int iVar2;
  int iVar3;
  DatabaseInterface *pDVar4;
  long lVar5;
  pointer puVar6;
  bool bVar7;
  Value v;
  size_t json_size;
  size_t num_hashes;
  vector<char,_std::allocator<char>_> json_buffer;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  Data local_118;
  size_type local_100;
  size_type local_f8;
  Document *local_f0;
  Number local_e8;
  iterator iStack_e0;
  char *local_d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d0;
  long local_b8;
  pointer local_b0;
  Number local_a8;
  SizeType local_a0;
  Data local_98;
  undefined8 *local_88;
  undefined8 *puStack_80;
  Stack<rapidjson::CrtAllocator> local_78;
  int local_48;
  undefined8 local_40;
  
  local_f0 = doc;
  pDVar4 = Fossilize::create_stream_archive_database((foz_path->_M_dataplus)._M_p,ReadOnly);
  if ((pDVar4 == (DatabaseInterface *)0x0) ||
     (iVar2 = (*pDVar4->_vptr_DatabaseInterface[2])(pDVar4), (char)iVar2 == '\0')) {
    bVar7 = false;
  }
  else {
    (local_f0->
    super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
    ).data_.n = (Number)0x0;
    (local_f0->
    super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
    ).data_.s.str = (Ch *)0x0;
    (local_f0->
    super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
    ).data_.f.flags = 4;
    local_e8.i64 = 0;
    iStack_e0._M_current = (char *)0x0;
    local_d8 = (char *)0x0;
    bVar7 = false;
    lVar5 = 0;
    while( true ) {
      local_f8 = 0;
      uVar1 = *(uint *)((long)parse_json_stats(std::__cxx11::string_const&,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>&)
                              ::stat_tags + lVar5);
      local_b8 = lVar5;
      iVar2 = (*pDVar4->_vptr_DatabaseInterface[6])(pDVar4,(ulong)uVar1,&local_f8,0);
      if ((char)iVar2 == '\0') break;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_d0,local_f8,(allocator_type *)&local_98.s);
      iVar2 = (*pDVar4->_vptr_DatabaseInterface[6])
                        (pDVar4,(ulong)uVar1,&local_f8,
                         local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start);
      if ((char)iVar2 == '\0') {
        if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_d0.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        break;
      }
      local_b0 = local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      puVar6 = local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          local_78.stack_ = (char *)0x0;
          local_78.stackTop_ = (char *)0x0;
          local_78.allocator_ = (CrtAllocator *)0x0;
          local_78.ownAllocator_ = (CrtAllocator *)0x0;
          local_88 = (undefined8 *)0x0;
          puStack_80 = (undefined8 *)0x0;
          local_98.n.i64 = (Number)0x0;
          local_98.s.str = (Ch *)0x0;
          local_78.stackEnd_ = (char *)0x0;
          local_78.initialCapacity_ = 0x400;
          local_48 = 0;
          local_40 = 0;
          local_88 = (undefined8 *)operator_new(0x28);
          *local_88 = 0;
          local_88[1] = 0x10000;
          local_88[2] = 0;
          local_88[3] = 0;
          local_88[4] = 0;
          local_100 = 0;
          puStack_80 = local_88;
          iVar3 = (*pDVar4->_vptr_DatabaseInterface[3])(pDVar4,(ulong)uVar1,*puVar6,&local_100,0,0);
          if ((char)iVar3 != '\0') {
            std::vector<char,_std::allocator<char>_>::resize
                      ((vector<char,_std::allocator<char>_> *)&local_e8.i,local_100);
            iVar3 = (*pDVar4->_vptr_DatabaseInterface[3])(pDVar4,(ulong)uVar1,*puVar6);
            if ((char)iVar3 != '\0') {
              local_118.n = (Number)((ulong)local_118.n & 0xffffffffffffff00);
              if (iStack_e0._M_current == local_d8) {
                std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                          ((vector<char,_std::allocator<char>_> *)&local_e8.i,iStack_e0,
                           (char *)&local_118);
              }
              else {
                *iStack_e0._M_current = '\0';
                iStack_e0._M_current = iStack_e0._M_current + 1;
              }
              local_a8 = local_e8;
              local_a0 = rapidjson::GenericStringRef<char>::NotNullStrLen
                                   ((GenericStringRef<char> *)&local_a8.i,(char *)local_e8);
              local_118.n = local_a8;
              local_118.s.str = (Ch *)local_a8;
              rapidjson::
              GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
              ::
              ParseStream<0u,rapidjson::UTF8<char>,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                        ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                          *)&local_98.s,(GenericStringStream<rapidjson::UTF8<char>_> *)&local_118.s)
              ;
              this = local_f0;
              if (local_48 == 0) {
                local_118.n.i64 = (Number)0x0;
                local_118.s.str = (char *)0x0;
                if (local_f0->allocator_ == (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0) {
LAB_0013a396:
                  __assert_fail("allocator_",
                                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                                ,0x9bc,
                                "Allocator &rapidjson::GenericDocument<rapidjson::UTF8<>>::GetAllocator() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>, StackAllocator = rapidjson::CrtAllocator]"
                               );
                }
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ::CopyFrom<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            *)&local_118.s,
                           (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)&local_98.s,local_f0->allocator_,false);
                allocator = this->allocator_;
                if (allocator == (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0)
                goto LAB_0013a396;
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::PushBack(&this->
                            super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           ,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)&local_118.s,allocator);
              }
            }
          }
          rapidjson::
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::Destroy((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     *)&local_98.s);
          rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_78);
          puVar6 = puVar6 + 1;
        } while (puVar6 != local_b0);
      }
      if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_d0.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d0.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((char)iVar2 == '\0') break;
      lVar5 = local_b8 + 4;
      bVar7 = lVar5 == 0xc;
      if (bVar7) break;
    }
    if ((char *)local_e8.i64 != (char *)0x0) {
      operator_delete((void *)local_e8,(long)local_d8 - (long)local_e8);
    }
  }
  if (pDVar4 != (DatabaseInterface *)0x0) {
    (*pDVar4->_vptr_DatabaseInterface[1])(pDVar4);
  }
  return bVar7;
}

Assistant:

static bool parse_json_stats(const std::string &foz_path, rapidjson::Document &doc)
{
	auto db = std::unique_ptr<DatabaseInterface>(create_stream_archive_database(foz_path.c_str(), DatabaseMode::ReadOnly));
	if (!db)
		return false;
	if (!db->prepare())
		return false;

	static const ResourceTag stat_tags[] = {
		RESOURCE_GRAPHICS_PIPELINE,
		RESOURCE_COMPUTE_PIPELINE,
		RESOURCE_RAYTRACING_PIPELINE,
	};

	doc.SetArray();

	std::vector<char> json_buffer;

	for (auto &tag : stat_tags)
	{
		size_t num_hashes = 0;
		if (!db->get_hash_list_for_resource_tag(tag, &num_hashes, nullptr))
			return false;
		std::vector<Hash> hashes(num_hashes);
		if (!db->get_hash_list_for_resource_tag(tag, &num_hashes, hashes.data()))
			return false;

		for (auto &hash : hashes)
		{
			rapidjson::Document tmp_doc;
			size_t json_size = 0;
			if (!db->read_entry(tag, hash, &json_size, nullptr, 0))
				continue;
			json_buffer.resize(json_size);
			if (!db->read_entry(tag, hash, &json_size, json_buffer.data(), 0))
				continue;
			json_buffer.push_back('\0');

			tmp_doc.Parse(rapidjson::StringRef(json_buffer.data()));
			if (tmp_doc.HasParseError())
				continue;

			rapidjson::Value v;
			v.CopyFrom(tmp_doc, doc.GetAllocator());
			doc.PushBack(v, doc.GetAllocator());
		}
	}

	return true;
}